

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_217e71::CpuZeropageIndexedTest_isb_zero_x_Test::
~CpuZeropageIndexedTest_isb_zero_x_Test(CpuZeropageIndexedTest_isb_zero_x_Test *this)

{
  CpuZeropageIndexedTest_isb_zero_x_Test *this_local;
  
  ~CpuZeropageIndexedTest_isb_zero_x_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuZeropageIndexedTest, isb_zero_x) {
    registers.a = 0x50;
    registers.p = V_FLAG | C_FLAG;
    expected.p = C_FLAG;
    expected.a = 0x50 - 0x07;
    memory_content = 0x07 - 0x01;

    run_readwrite_instruction(ISB_ZEROX, IndexReg::X, 0x07);
}